

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highlighting.cpp
# Opt level: O1

vector<duckdb::highlightToken,_true> *
duckdb::GetParseTokens
          (vector<duckdb::highlightToken,_true> *__return_storage_ptr__,char *buf,size_t len)

{
  pointer *pphVar1;
  SimplifiedTokenType SVar2;
  iterator iVar3;
  reference pvVar4;
  InternalException *this;
  pointer pSVar5;
  highlightToken new_token;
  vector<duckdb::SimplifiedToken,_true> parseTokens;
  string sql;
  string local_a0;
  highlightToken local_80;
  vector<duckdb::SimplifiedToken,_true> local_68;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,buf,buf + len);
  Parser::Tokenize(&local_68,&local_50);
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
  super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_68.super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
      super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
      super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar5 = local_68.
             super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
             super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_80.start = 0;
      local_80.search_match = false;
      SVar2 = pSVar5->type;
      if (SIMPLIFIED_TOKEN_COMMENT < SVar2) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Unrecognized token type","");
        InternalException::InternalException(this,&local_a0);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_80.start = pSVar5->start;
      iVar3._M_current =
           (__return_storage_ptr__->
           super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
           super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_80.type = SVar2;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
        _M_realloc_insert<duckdb::highlightToken_const&>
                  ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                   __return_storage_ptr__,iVar3,&local_80);
      }
      else {
        *(ulong *)&(iVar3._M_current)->search_match = (ulong)(uint7)local_80._17_7_ << 8;
        *(ulong *)iVar3._M_current = CONCAT71(local_80._1_7_,SVar2);
        (iVar3._M_current)->start = local_80.start;
        pphVar1 = &(__return_storage_ptr__->
                   super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                   super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pphVar1 = *pphVar1 + 1;
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != local_68.
                       super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                       .
                       super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((__return_storage_ptr__->
      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->
      super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar4 = vector<duckdb::highlightToken,_true>::operator[](__return_storage_ptr__,0);
    if (pvVar4->start != 0) {
      local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffffffffff00;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_a0._M_string_length = 0;
      ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::insert
                (&__return_storage_ptr__->
                  super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>,
                 (__return_storage_ptr__->
                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_start,(value_type *)&local_a0);
    }
  }
  iVar3._M_current =
       (__return_storage_ptr__->
       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (((__return_storage_ptr__->
       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
       super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
       super__Vector_impl_data._M_start == iVar3._M_current) && (local_50._M_string_length != 0)) {
    local_a0._M_dataplus._M_p = local_a0._M_dataplus._M_p & 0xffffffffffffff00;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_a0._M_string_length = 0;
    if (iVar3._M_current ==
        (__return_storage_ptr__->
        super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
        super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>>::
      _M_realloc_insert<duckdb::highlightToken_const&>
                ((vector<duckdb::highlightToken,std::allocator<duckdb::highlightToken>> *)
                 __return_storage_ptr__,iVar3,(highlightToken *)&local_a0);
    }
    else {
      *(ulong *)&(iVar3._M_current)->search_match =
           (ulong)(uint7)local_a0.field_2._M_allocated_capacity._1_7_ << 8;
      *(pointer *)iVar3._M_current = local_a0._M_dataplus._M_p;
      (iVar3._M_current)->start = 0;
      pphVar1 = &(__return_storage_ptr__->
                 super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
                 super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pphVar1 = *pphVar1 + 1;
    }
  }
  if (local_68.super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
      super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>.
                    super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<highlightToken> GetParseTokens(char *buf, size_t len) {
	string sql(buf, len);
	auto parseTokens = duckdb::Parser::Tokenize(sql);

	vector<highlightToken> tokens;
	for (auto &token : parseTokens) {
		highlightToken new_token;
		new_token.type = convertToken(token.type);
		new_token.start = token.start;
		tokens.push_back(new_token);
	}

	if (!tokens.empty() && tokens[0].start > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.insert(tokens.begin(), new_token);
	}
	if (tokens.empty() && sql.size() > 0) {
		highlightToken new_token;
		new_token.type = tokenType::TOKEN_IDENTIFIER;
		new_token.start = 0;
		tokens.push_back(new_token);
	}
	return tokens;
}